

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::StartGroup(BasicReporter *this,string *groupName)

{
  SpanInfo SStack_38;
  
  SpanInfo::SpanInfo(&SStack_38,groupName);
  SpanInfo::operator=(&this->m_groupSpan,&SStack_38);
  std::__cxx11::string::~string((string *)&SStack_38);
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_groupSpan = groupName;
        }